

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void statPush(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  void *pvVar2;
  int iChng;
  StatAccum *p;
  int i;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  pvVar2 = sqlite3_value_blob(*argv);
  iVar1 = sqlite3_value_int(argv[1]);
  if (*(int *)((long)pvVar2 + 0xc) == 0) {
    for (p._4_4_ = 0; p._4_4_ < *(int *)((long)pvVar2 + 0x14); p._4_4_ = p._4_4_ + 1) {
      *(undefined4 *)(*(long *)((long)pvVar2 + 0x20) + (long)p._4_4_ * 4) = 1;
    }
  }
  else {
    for (p._4_4_ = 0; p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
      *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)p._4_4_ * 4) =
           *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)p._4_4_ * 4) + 1;
    }
    while (p._4_4_ = iVar1, p._4_4_ < *(int *)((long)pvVar2 + 0x14)) {
      *(int *)(*(long *)((long)pvVar2 + 0x28) + (long)p._4_4_ * 4) =
           *(int *)(*(long *)((long)pvVar2 + 0x28) + (long)p._4_4_ * 4) + 1;
      *(undefined4 *)(*(long *)((long)pvVar2 + 0x20) + (long)p._4_4_ * 4) = 1;
      iVar1 = p._4_4_ + 1;
    }
  }
  *(int *)((long)pvVar2 + 0xc) = *(int *)((long)pvVar2 + 0xc) + 1;
  if ((*(int *)((long)pvVar2 + 0x10) != 0) &&
     (*(int *)((long)pvVar2 + 0x10) * (*(byte *)((long)pvVar2 + 0x1c) + 1) <
      *(uint *)((long)pvVar2 + 0xc))) {
    *(char *)((long)pvVar2 + 0x1c) = *(char *)((long)pvVar2 + 0x1c) + '\x01';
    sqlite3_result_int(context,(uint)(**(int **)((long)pvVar2 + 0x28) != 0));
  }
  return;
}

Assistant:

static void statPush(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;

  /* The three function arguments */
  StatAccum *p = (StatAccum*)sqlite3_value_blob(argv[0]);
  int iChng = sqlite3_value_int(argv[1]);

  UNUSED_PARAMETER( argc );
  UNUSED_PARAMETER( context );
  assert( p->nCol>0 );
  assert( iChng<p->nCol );

  if( p->nRow==0 ){
    /* This is the first call to this function. Do initialization. */
    for(i=0; i<p->nCol; i++) p->current.anEq[i] = 1;
  }else{
    /* Second and subsequent calls get processed here */
#ifdef SQLITE_ENABLE_STAT4
    if( p->mxSample ) samplePushPrevious(p, iChng);
#endif

    /* Update anDLt[], anLt[] and anEq[] to reflect the values that apply
    ** to the current row of the index. */
    for(i=0; i<iChng; i++){
      p->current.anEq[i]++;
    }
    for(i=iChng; i<p->nCol; i++){
      p->current.anDLt[i]++;
#ifdef SQLITE_ENABLE_STAT4
      if( p->mxSample ) p->current.anLt[i] += p->current.anEq[i];
#endif
      p->current.anEq[i] = 1;
    }
  }

  p->nRow++;
#ifdef SQLITE_ENABLE_STAT4
  if( p->mxSample ){
    tRowcnt nLt;
    if( sqlite3_value_type(argv[2])==SQLITE_INTEGER ){
      sampleSetRowidInt64(p->db, &p->current, sqlite3_value_int64(argv[2]));
    }else{
      sampleSetRowid(p->db, &p->current, sqlite3_value_bytes(argv[2]),
                                         sqlite3_value_blob(argv[2]));
    }
    p->current.iHash = p->iPrn = p->iPrn*1103515245 + 12345;

    nLt = p->current.anLt[p->nCol-1];
    /* Check if this is to be a periodic sample. If so, add it. */
    if( (nLt/p->nPSample)!=(nLt+1)/p->nPSample ){
      p->current.isPSample = 1;
      p->current.iCol = 0;
      sampleInsert(p, &p->current, p->nCol-1);
      p->current.isPSample = 0;
    }

    /* Update the aBest[] array. */
    for(i=0; i<(p->nCol-1); i++){
      p->current.iCol = i;
      if( i>=iChng || sampleIsBetterPost(p, &p->current, &p->aBest[i]) ){
        sampleCopy(p, &p->aBest[i], &p->current);
      }
    }
  }else
#endif
  if( p->nLimit && p->nRow>(tRowcnt)p->nLimit*(p->nSkipAhead+1) ){
    p->nSkipAhead++;
    sqlite3_result_int(context, p->current.anDLt[0]>0);
  }
}